

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomentumHistogram.cpp
# Opt level: O0

ssize_t __thiscall
OpenMD::MomentumHistogram::write(MomentumHistogram *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  ssize_t sVar7;
  uint i;
  ofstream rdfStream;
  uint local_218;
  ostream local_208 [512];
  MomentumHistogram *local_8;
  
  local_8 = this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"MomentumHistogram: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"#");
    poVar3 = std::operator<<(poVar3,(string *)&this->momentumLabel_);
    poVar3 = std::operator<<(poVar3,(string *)&this->componentLabel_);
    std::operator<<(poVar3," distribtution \n");
    poVar3 = std::operator<<(local_208,"# nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->nProcessed_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# selection: (");
    poVar3 = std::operator<<(poVar3,(string *)&this->selectionScript_);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"# ");
    poVar3 = std::operator<<(poVar3,"Bin_center");
    std::operator<<(poVar3,"\tcount\n");
    for (local_218 = 0; sVar4 = std::vector<double,_std::allocator<double>_>::size(&this->histList_)
        , local_218 < sVar4; local_218 = local_218 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->bincenter_,(ulong)local_218);
      poVar3 = (ostream *)std::ostream::operator<<(local_208,*pvVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&this->histList_,(ulong)local_218);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  sVar7 = std::ofstream::~ofstream(local_208);
  return sVar7;
}

Assistant:

void MomentumHistogram::write() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#" << momentumLabel_ << componentLabel_
                << " distribtution \n";
      rdfStream << "# nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "# selection: (" << selectionScript_ << ")\n";
      rdfStream << "# "
                << "Bin_center"
                << "\tcount\n";
      for (unsigned int i = 0; i < histList_.size(); ++i) {
        rdfStream << bincenter_[i] << "\t" << histList_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MomentumHistogram: unable to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    rdfStream.close();
  }